

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O1

void __thiscall hacd::vector<HACD::Vec3>::recreate(vector<HACD::Vec3> *this,HaU32 capacity)

{
  uint uVar1;
  Vec3 *__ptr;
  HaF32 HVar2;
  Vec3 *pVVar3;
  Vec3 *pVVar4;
  Vec3 *pVVar5;
  
  if (capacity == 0) {
    pVVar3 = (Vec3 *)0x0;
  }
  else {
    pVVar3 = (Vec3 *)malloc((ulong)capacity * 0xc);
    if ((pVVar3 == (Vec3 *)0x0) || (pVVar3 == this->mData)) {
      __assert_fail("!capacity || newData && newData != mData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x23b,"void hacd::vector<HACD::Vec3>::recreate(HaU32) [T = HACD::Vec3]");
    }
  }
  uVar1 = this->mSize;
  __ptr = this->mData;
  if ((ulong)uVar1 != 0) {
    pVVar4 = __ptr;
    pVVar5 = pVVar3;
    do {
      pVVar5->z = pVVar4->z;
      HVar2 = pVVar4->y;
      pVVar5->x = pVVar4->x;
      pVVar5->y = HVar2;
      pVVar5 = pVVar5 + 1;
      pVVar4 = pVVar4 + 1;
    } while (pVVar5 < pVVar3 + uVar1);
  }
  if (-1 < (int)this->mCapacity) {
    free(__ptr);
  }
  this->mData = pVVar3;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}